

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concur19.cc
# Opt level: O2

void __thiscall
tchecker::tck_reach::concur19::graph_t::graph_t
          (graph_t *this,shared_ptr<tchecker::refzg::refzg_t> *refzg,size_t block_size,
          size_t table_size)

{
  node_hash_t local_49;
  node_le_t local_48;
  
  node_le_t::node_le_t
            (&local_48,
             (((refzg->super___shared_ptr<tchecker::refzg::refzg_t,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->_system).
             super___shared_ptr<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  tchecker::graph::subsumption::
  graph_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t,_tchecker::tck_reach::concur19::node_hash_t,_tchecker::tck_reach::concur19::node_le_t>
  ::graph_t(&this->
             super_graph_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t,_tchecker::tck_reach::concur19::node_hash_t,_tchecker::tck_reach::concur19::node_le_t>
            ,block_size,table_size,&local_49,&local_48);
  node_le_t::~node_le_t(&local_48);
  (this->
  super_graph_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t,_tchecker::tck_reach::concur19::node_hash_t,_tchecker::tck_reach::concur19::node_le_t>
  )._vptr_graph_t = (_func_int **)&PTR__graph_t_00287e40;
  std::__shared_ptr<tchecker::refzg::refzg_t,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->_refzg).
              super___shared_ptr<tchecker::refzg::refzg_t,_(__gnu_cxx::_Lock_policy)2>,
             &refzg->super___shared_ptr<tchecker::refzg::refzg_t,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

graph_t::graph_t(std::shared_ptr<tchecker::refzg::refzg_t> const & refzg, std::size_t block_size, std::size_t table_size)
    : tchecker::graph::subsumption::graph_t<tchecker::tck_reach::concur19::node_t, tchecker::tck_reach::concur19::edge_t,
                                            tchecker::tck_reach::concur19::node_hash_t,
                                            tchecker::tck_reach::concur19::node_le_t>(
          block_size, table_size, tchecker::tck_reach::concur19::node_hash_t(),
          tchecker::tck_reach::concur19::node_le_t(refzg->system())),
      _refzg(refzg)
{
}